

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Globals.h
# Opt level: O1

int InitGlobals(void)

{
  int iVar1;
  int iVar2;
  deque<unsigned_char,_std::allocator<unsigned_char>_> *__x;
  char (*pacVar3) [256];
  long lVar4;
  CRITICAL_SECTION *pCVar5;
  char (*__s) [256];
  CRITICAL_SECTION *__mutex;
  pthread_mutexattr_t attr;
  timespec local_48;
  int local_34;
  
  seanetfilenextlinecmd = -1;
  bPauseBlueView[0] = 0;
  bPauseBlueView[1] = 0;
  bRestartBlueView[0] = 0;
  bRestartBlueView[1] = 0;
  GNSSqualityNMEADevice[0] = 0;
  GNSSqualityNMEADevice[1] = 0;
  bPauseNMEADevice[0] = 0;
  bPauseNMEADevice[1] = 0;
  bRestartNMEADevice[0] = 0;
  bRestartNMEADevice[1] = 0;
  __x = RTCMusers;
  lVar4 = 0;
  do {
    GNSSqualityublox[lVar4] = 0;
    bPauseublox[lVar4] = 0;
    bRestartublox[lVar4] = 0;
    std::
    vector<std::deque<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::deque<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::push_back(&RTCMuserslist,__x);
    lVar4 = lVar4 + 1;
    __x = __x + 1;
  } while (lVar4 != 3);
  bEnableMAVLinkDeviceIN[2] = 0;
  bEnableMAVLinkDeviceIN[0] = 0;
  bEnableMAVLinkDeviceIN[1] = 0;
  bDisplayStatusTextMAVLinkDevice[2] = 0;
  bDisplayStatusTextMAVLinkDevice[0] = 0;
  bDisplayStatusTextMAVLinkDevice[1] = 0;
  custom_modeMAVLinkDevice[0] = -1;
  custom_modeMAVLinkDevice[1] = -1;
  custom_modeMAVLinkDevice[2] = -1;
  iArmMAVLinkDevice[0] = -1;
  iArmMAVLinkDevice[1] = -1;
  iArmMAVLinkDevice[2] = -1;
  setattitudetargetperiodMAVLinkDevice[0] = -1;
  setattitudetargetperiodMAVLinkDevice[1] = -1;
  setattitudetargetperiodMAVLinkDevice[2] = -1;
  setattitudetargettypeMAVLinkDevice[0] = -1;
  setattitudetargettypeMAVLinkDevice[1] = -1;
  setattitudetargettypeMAVLinkDevice[2] = -1;
  setattitudetargetrollMAVLinkDevice[0] = 0.0;
  setattitudetargetrollMAVLinkDevice[1] = 0.0;
  setattitudetargetrollMAVLinkDevice[2] = 0.0;
  setattitudetargetpitchMAVLinkDevice[0] = 0.0;
  setattitudetargetpitchMAVLinkDevice[1] = 0.0;
  setattitudetargetpitchMAVLinkDevice[2] = 0.0;
  setattitudetargetyawMAVLinkDevice[0] = 0.0;
  setattitudetargetyawMAVLinkDevice[1] = 0.0;
  setattitudetargetyawMAVLinkDevice[2] = 0.0;
  setattitudetargetroll_rateMAVLinkDevice[2] = 0.0;
  setattitudetargetroll_rateMAVLinkDevice[0] = 0.0;
  setattitudetargetroll_rateMAVLinkDevice[1] = 0.0;
  setattitudetargetpitch_rateMAVLinkDevice[2] = 0.0;
  setattitudetargetpitch_rateMAVLinkDevice[0] = 0.0;
  setattitudetargetpitch_rateMAVLinkDevice[1] = 0.0;
  setattitudetargetyaw_rateMAVLinkDevice[2] = 0.0;
  setattitudetargetyaw_rateMAVLinkDevice[0] = 0.0;
  setattitudetargetyaw_rateMAVLinkDevice[1] = 0.0;
  setattitudetargetthrustMAVLinkDevice[2] = 0.0;
  setattitudetargetthrustMAVLinkDevice[0] = 0.0;
  setattitudetargetthrustMAVLinkDevice[1] = 0.0;
  bTakeoffMAVLinkDevice[2] = 0;
  bTakeoffMAVLinkDevice[0] = 0;
  bTakeoffMAVLinkDevice[1] = 0;
  takeoff_altitudeMAVLinkDevice[2] = 0.0;
  takeoff_altitudeMAVLinkDevice[0] = 0.0;
  takeoff_altitudeMAVLinkDevice[1] = 0.0;
  bLandMAVLinkDevice[2] = 0;
  bLandMAVLinkDevice[0] = 0;
  bLandMAVLinkDevice[1] = 0;
  land_yawMAVLinkDevice[2] = 0.0;
  land_yawMAVLinkDevice[0] = 0.0;
  land_yawMAVLinkDevice[1] = 0.0;
  land_latitudeMAVLinkDevice[2] = 0.0;
  land_latitudeMAVLinkDevice[0] = 0.0;
  land_latitudeMAVLinkDevice[1] = 0.0;
  land_longitudeMAVLinkDevice[2] = 0.0;
  land_longitudeMAVLinkDevice[0] = 0.0;
  land_longitudeMAVLinkDevice[1] = 0.0;
  land_altitudeMAVLinkDevice[2] = 0.0;
  land_altitudeMAVLinkDevice[0] = 0.0;
  land_altitudeMAVLinkDevice[1] = 0.0;
  u1_servo_out_MAVLinkDevice[2] = 0.0;
  u1_servo_out_MAVLinkDevice[0] = 0.0;
  u1_servo_out_MAVLinkDevice[1] = 0.0;
  u2_servo_out_MAVLinkDevice[2] = 0.0;
  u2_servo_out_MAVLinkDevice[0] = 0.0;
  u2_servo_out_MAVLinkDevice[1] = 0.0;
  u3_servo_out_MAVLinkDevice[2] = 0.0;
  u3_servo_out_MAVLinkDevice[0] = 0.0;
  u3_servo_out_MAVLinkDevice[1] = 0.0;
  u4_servo_out_MAVLinkDevice[2] = 0.0;
  u4_servo_out_MAVLinkDevice[0] = 0.0;
  u4_servo_out_MAVLinkDevice[1] = 0.0;
  u5_servo_out_MAVLinkDevice[2] = 0.0;
  u5_servo_out_MAVLinkDevice[0] = 0.0;
  u5_servo_out_MAVLinkDevice[1] = 0.0;
  u6_servo_out_MAVLinkDevice[2] = 0.0;
  u6_servo_out_MAVLinkDevice[0] = 0.0;
  u6_servo_out_MAVLinkDevice[1] = 0.0;
  u7_servo_out_MAVLinkDevice[2] = 0.0;
  u7_servo_out_MAVLinkDevice[0] = 0.0;
  u7_servo_out_MAVLinkDevice[1] = 0.0;
  u8_servo_out_MAVLinkDevice[2] = 0.0;
  u8_servo_out_MAVLinkDevice[0] = 0.0;
  u8_servo_out_MAVLinkDevice[1] = 0.0;
  GNSSqualityMAVLinkDevice[2] = 0;
  GNSSqualityMAVLinkDevice[0] = 0;
  GNSSqualityMAVLinkDevice[1] = 0;
  bPauseMAVLinkDevice[2] = 0;
  bPauseMAVLinkDevice[0] = 0;
  bPauseMAVLinkDevice[1] = 0;
  bRestartMAVLinkDevice[2] = 0;
  bRestartMAVLinkDevice[0] = 0;
  bRestartMAVLinkDevice[1] = 0;
  ShowGetPositionMaestroPololu[2] = -1;
  ShowGetPositionMaestroPololu[0] = -1;
  ShowGetPositionMaestroPololu[1] = -1;
  SetPositionMaestroPololu[2] = -1;
  SetPositionMaestroPololu[0] = -1;
  SetPositionMaestroPololu[1] = -1;
  bPausePololu[2] = 0;
  bPausePololu[0] = 0;
  bPausePololu[1] = 0;
  bRestartPololu[2] = 0;
  bRestartPololu[0] = 0;
  bRestartPololu[1] = 0;
  bPauseRoboteq[0] = 0;
  bPauseRoboteq[1] = 0;
  bRestartRoboteq[0] = 0;
  bRestartRoboteq[1] = 0;
  pacVar3 = endvideorecordfilenames;
  __s = videorecordfilenames;
  __mutex = VideoRecordRequestsCS;
  pCVar5 = imgsCS;
  lVar4 = 0;
  do {
    iVar1 = pthread_mutexattr_init((pthread_mutexattr_t *)&local_48);
    if (iVar1 == 0) {
      iVar1 = pthread_mutexattr_settype((pthread_mutexattr_t *)&local_48,1);
      if (iVar1 == 0) {
        local_34 = pthread_mutex_init((pthread_mutex_t *)pCVar5,(pthread_mutexattr_t *)&local_48);
        iVar1 = pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_48);
        if ((local_34 == 0) && (iVar1 != 0)) {
          pthread_mutex_destroy((pthread_mutex_t *)pCVar5);
        }
      }
      else {
        pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_48);
      }
    }
    *(undefined8 *)((long)HorizontalBeamVideo + lVar4 * 2) = 0x4051800000000000;
    *(undefined8 *)((long)VerticalBeamVideo + lVar4 * 2) = 0x4049000000000000;
    *(undefined8 *)((long)xVideo + lVar4 * 2) = 0;
    *(undefined8 *)((long)yVideo + lVar4 * 2) = 0;
    *(undefined8 *)((long)zVideo + lVar4 * 2) = 0;
    *(undefined8 *)((long)phiVideo + lVar4 * 2) = 0;
    *(undefined8 *)((long)thetaVideo + lVar4 * 2) = 0;
    *(undefined8 *)((long)psiVideo + lVar4 * 2) = 0;
    *(undefined4 *)((long)bPauseVideo + lVar4) = 0;
    *(undefined4 *)((long)bRestartVideo + lVar4) = 0;
    iVar1 = pthread_mutexattr_init((pthread_mutexattr_t *)&local_48);
    if (iVar1 == 0) {
      iVar1 = pthread_mutexattr_settype((pthread_mutexattr_t *)&local_48,1);
      if (iVar1 == 0) {
        local_34 = pthread_mutex_init((pthread_mutex_t *)__mutex,(pthread_mutexattr_t *)&local_48);
        iVar1 = pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_48);
        if ((local_34 == 0) && (iVar1 != 0)) {
          pthread_mutex_destroy((pthread_mutex_t *)__mutex);
        }
      }
      else {
        pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_48);
      }
    }
    *(undefined4 *)((long)VideoRecordRequests + lVar4) = 0;
    *(undefined4 *)((long)bVideoRecordRestart + lVar4) = 0;
    memset(__s,0,0x100);
    *(undefined8 *)((long)endvideorecordfiles + lVar4 * 2) = 0;
    memset(pacVar3,0,0x100);
    *(int *)((long)videorecordwidth + lVar4) = videoimgwidth;
    *(int *)((long)videorecordheight + lVar4) = videoimgheight;
    lVar4 = lVar4 + 4;
    pacVar3 = pacVar3 + 1;
    __s = __s + 1;
    __mutex = __mutex + 1;
    pCVar5 = pCVar5 + 1;
  } while (lVar4 != 0x14);
  if (0 < nbopencvgui) {
    pCVar5 = dispimgsCS;
    lVar4 = 0;
    do {
      iVar1 = pthread_mutexattr_init((pthread_mutexattr_t *)&local_48);
      if (iVar1 == 0) {
        iVar1 = pthread_mutexattr_settype((pthread_mutexattr_t *)&local_48,1);
        if (iVar1 == 0) {
          iVar1 = pthread_mutex_init((pthread_mutex_t *)pCVar5,(pthread_mutexattr_t *)&local_48);
          iVar2 = pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_48);
          if ((iVar1 == 0) && (iVar2 != 0)) {
            pthread_mutex_destroy((pthread_mutex_t *)pCVar5);
          }
        }
        else {
          pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_48);
        }
      }
      lVar4 = lVar4 + 1;
      pCVar5 = pCVar5 + 1;
    } while (lVar4 < nbopencvgui);
  }
  iVar1 = pthread_mutexattr_init((pthread_mutexattr_t *)&local_48);
  if (iVar1 == 0) {
    iVar1 = pthread_mutexattr_settype((pthread_mutexattr_t *)&local_48,1);
    if (iVar1 == 0) {
      iVar1 = pthread_mutex_init((pthread_mutex_t *)&SonarAltitudeEstimationCS,
                                 (pthread_mutexattr_t *)&local_48);
      iVar2 = pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_48);
      if ((iVar1 == 0) && (iVar2 != 0)) {
        pthread_mutex_destroy((pthread_mutex_t *)&SonarAltitudeEstimationCS);
      }
    }
    else {
      pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_48);
    }
  }
  pacVar3 = ExternalProgramTriggerFileName;
  pCVar5 = ExternalProgramTriggerCS;
  lVar4 = 0;
  do {
    *(undefined4 *)((long)bExternalProgramTrigger + lVar4) = 0;
    iVar1 = pthread_mutexattr_init((pthread_mutexattr_t *)&local_48);
    if (iVar1 == 0) {
      iVar1 = pthread_mutexattr_settype((pthread_mutexattr_t *)&local_48,1);
      if (iVar1 == 0) {
        iVar1 = pthread_mutex_init((pthread_mutex_t *)pCVar5,(pthread_mutexattr_t *)&local_48);
        iVar2 = pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_48);
        if ((iVar1 == 0) && (iVar2 != 0)) {
          pthread_mutex_destroy((pthread_mutex_t *)pCVar5);
        }
      }
      else {
        pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_48);
      }
    }
    memset(pacVar3,0,0x100);
    *(undefined4 *)((long)period_externalprogramtrigger + lVar4) = 100;
    *(undefined4 *)((long)retrydelay_externalprogramtrigger + lVar4) = 100;
    *(undefined4 *)((long)nbretries_externalprogramtrigger + lVar4) = 0xffffffff;
    *(undefined4 *)((long)procid_externalprogramtrigger + lVar4) = 0xffffffff;
    *(undefined4 *)((long)bExternalProgramTriggerDetected + lVar4) = 0;
    lVar4 = lVar4 + 4;
    pacVar3 = pacVar3 + 1;
    pCVar5 = pCVar5 + 1;
  } while (lVar4 != 0x20);
  iVar1 = pthread_mutexattr_init((pthread_mutexattr_t *)&local_48);
  if (iVar1 == 0) {
    iVar1 = pthread_mutexattr_settype((pthread_mutexattr_t *)&local_48,1);
    if (iVar1 == 0) {
      iVar1 = pthread_mutex_init((pthread_mutex_t *)&FollowMeCS,(pthread_mutexattr_t *)&local_48);
      iVar2 = pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_48);
      if ((iVar1 == 0) && (iVar2 != 0)) {
        pthread_mutex_destroy((pthread_mutex_t *)&FollowMeCS);
      }
    }
    else {
      pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_48);
    }
  }
  iVar1 = pthread_mutexattr_init((pthread_mutexattr_t *)&local_48);
  if (iVar1 == 0) {
    iVar1 = pthread_mutexattr_settype((pthread_mutexattr_t *)&local_48,1);
    if (iVar1 == 0) {
      iVar1 = pthread_mutex_init((pthread_mutex_t *)&MDMCS,(pthread_mutexattr_t *)&local_48);
      iVar2 = pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_48);
      if ((iVar1 == 0) && (iVar2 != 0)) {
        pthread_mutex_destroy((pthread_mutex_t *)&MDMCS);
      }
    }
    else {
      pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_48);
    }
  }
  iVar1 = pthread_mutexattr_init((pthread_mutexattr_t *)&local_48);
  if (iVar1 == 0) {
    iVar1 = pthread_mutexattr_settype((pthread_mutexattr_t *)&local_48,1);
    if (iVar1 == 0) {
      iVar1 = pthread_mutex_init((pthread_mutex_t *)&SeanetOverlayImgCS,
                                 (pthread_mutexattr_t *)&local_48);
      iVar2 = pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_48);
      if ((iVar1 == 0) && (iVar2 != 0)) {
        pthread_mutex_destroy((pthread_mutex_t *)&SeanetOverlayImgCS);
      }
    }
    else {
      pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_48);
    }
  }
  iVar1 = pthread_mutexattr_init((pthread_mutexattr_t *)&local_48);
  if (iVar1 == 0) {
    iVar1 = pthread_mutexattr_settype((pthread_mutexattr_t *)&local_48,1);
    if (iVar1 == 0) {
      iVar1 = pthread_mutex_init((pthread_mutex_t *)&SeanetConnectingCS,
                                 (pthread_mutexattr_t *)&local_48);
      iVar2 = pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_48);
      if ((iVar1 == 0) && (iVar2 != 0)) {
        pthread_mutex_destroy((pthread_mutex_t *)&SeanetConnectingCS);
      }
    }
    else {
      pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_48);
    }
  }
  iVar1 = pthread_mutexattr_init((pthread_mutexattr_t *)&local_48);
  if (iVar1 == 0) {
    iVar1 = pthread_mutexattr_settype((pthread_mutexattr_t *)&local_48,1);
    if (iVar1 == 0) {
      iVar1 = pthread_mutex_init((pthread_mutex_t *)&SeanetDataCS,(pthread_mutexattr_t *)&local_48);
      iVar2 = pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_48);
      if ((iVar1 == 0) && (iVar2 != 0)) {
        pthread_mutex_destroy((pthread_mutex_t *)&SeanetDataCS);
      }
    }
    else {
      pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_48);
    }
  }
  iVar1 = pthread_mutexattr_init((pthread_mutexattr_t *)&local_48);
  if (iVar1 == 0) {
    iVar1 = pthread_mutexattr_settype((pthread_mutexattr_t *)&local_48,1);
    if (iVar1 == 0) {
      iVar1 = pthread_mutex_init((pthread_mutex_t *)&StateVariablesCS,
                                 (pthread_mutexattr_t *)&local_48);
      iVar2 = pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_48);
      if ((iVar1 == 0) && (iVar2 != 0)) {
        pthread_mutex_destroy((pthread_mutex_t *)&StateVariablesCS);
      }
    }
    else {
      pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_48);
    }
  }
  iVar1 = pthread_mutexattr_init((pthread_mutexattr_t *)&local_48);
  if (iVar1 == 0) {
    iVar1 = pthread_mutexattr_settype((pthread_mutexattr_t *)&local_48,1);
    if (iVar1 == 0) {
      iVar1 = pthread_mutex_init((pthread_mutex_t *)&MissionFilesCS,(pthread_mutexattr_t *)&local_48
                                );
      iVar2 = pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_48);
      if ((iVar1 == 0) && (iVar2 != 0)) {
        pthread_mutex_destroy((pthread_mutex_t *)&MissionFilesCS);
      }
    }
    else {
      pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_48);
    }
  }
  iVar1 = pthread_mutexattr_init((pthread_mutexattr_t *)&local_48);
  if (iVar1 == 0) {
    iVar1 = pthread_mutexattr_settype((pthread_mutexattr_t *)&local_48,1);
    if (iVar1 == 0) {
      iVar1 = pthread_mutex_init((pthread_mutex_t *)&OpenCVGUICS,(pthread_mutexattr_t *)&local_48);
      iVar2 = pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_48);
      if ((iVar1 == 0) && (iVar2 != 0)) {
        pthread_mutex_destroy((pthread_mutex_t *)&OpenCVGUICS);
      }
    }
    else {
      pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_48);
    }
  }
  iVar1 = pthread_mutexattr_init((pthread_mutexattr_t *)&local_48);
  if (iVar1 == 0) {
    iVar1 = pthread_mutexattr_settype((pthread_mutexattr_t *)&local_48,1);
    if (iVar1 == 0) {
      iVar1 = pthread_mutex_init((pthread_mutex_t *)&OpenCVVideoCS,(pthread_mutexattr_t *)&local_48)
      ;
      iVar2 = pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_48);
      if ((iVar1 == 0) && (iVar2 != 0)) {
        pthread_mutex_destroy((pthread_mutex_t *)&OpenCVVideoCS);
      }
    }
    else {
      pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_48);
    }
  }
  iVar1 = pthread_mutexattr_init((pthread_mutexattr_t *)&local_48);
  if (iVar1 == 0) {
    iVar1 = pthread_mutexattr_settype((pthread_mutexattr_t *)&local_48,1);
    if (iVar1 == 0) {
      iVar1 = pthread_mutex_init((pthread_mutex_t *)&OpenCVVideoRecordCS,
                                 (pthread_mutexattr_t *)&local_48);
      iVar2 = pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_48);
      if ((iVar1 == 0) && (iVar2 != 0)) {
        pthread_mutex_destroy((pthread_mutex_t *)&OpenCVVideoRecordCS);
      }
    }
    else {
      pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_48);
    }
  }
  iVar1 = pthread_mutexattr_init((pthread_mutexattr_t *)&local_48);
  if (iVar1 == 0) {
    iVar1 = pthread_mutexattr_settype((pthread_mutexattr_t *)&local_48,1);
    if (iVar1 == 0) {
      iVar1 = pthread_mutex_init((pthread_mutex_t *)&idsCS,(pthread_mutexattr_t *)&local_48);
      iVar2 = pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_48);
      if ((iVar1 == 0) && (iVar2 != 0)) {
        pthread_mutex_destroy((pthread_mutex_t *)&idsCS);
      }
    }
    else {
      pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_48);
    }
  }
  iVar1 = pthread_mutexattr_init((pthread_mutexattr_t *)&local_48);
  if (iVar1 == 0) {
    iVar1 = pthread_mutexattr_settype((pthread_mutexattr_t *)&local_48,1);
    if (iVar1 == 0) {
      iVar1 = pthread_mutex_init((pthread_mutex_t *)&RegistersCS,(pthread_mutexattr_t *)&local_48);
      iVar2 = pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_48);
      if ((iVar1 == 0) && (iVar2 != 0)) {
        pthread_mutex_destroy((pthread_mutex_t *)&RegistersCS);
      }
    }
    else {
      pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_48);
    }
  }
  iVar1 = pthread_mutexattr_init((pthread_mutexattr_t *)&local_48);
  if (iVar1 == 0) {
    iVar1 = pthread_mutexattr_settype((pthread_mutexattr_t *)&local_48,1);
    if (iVar1 == 0) {
      iVar1 = pthread_mutex_init((pthread_mutex_t *)&strtimeCS,(pthread_mutexattr_t *)&local_48);
      iVar2 = pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_48);
      if ((iVar1 == 0) && (iVar2 != 0)) {
        pthread_mutex_destroy((pthread_mutex_t *)&strtimeCS);
      }
    }
    else {
      pthread_mutexattr_destroy((pthread_mutexattr_t *)&local_48);
    }
  }
  opencvguikey = -1;
  opencvguikeytargetid = -1;
  iVar1 = clock_getres(4,(timespec *)&chrono_mission.Frequency);
  if (iVar1 == 0) {
    iVar1 = clock_gettime(4,(timespec *)&chrono_mission);
    if (iVar1 == 0) {
      chrono_mission.Suspended = 0;
      chrono_mission.Finish.tv_sec = 0;
      chrono_mission.Finish.tv_nsec = 0;
      chrono_mission.Duration.tv_sec = 0;
      chrono_mission.Duration.tv_nsec = 0;
    }
  }
  if (chrono_mission.Suspended == 0) {
    clock_gettime(4,&local_48);
    chrono_mission.Finish.tv_sec = local_48.tv_sec;
    chrono_mission.Finish.tv_nsec = local_48.tv_nsec;
    local_48.tv_sec =
         (local_48.tv_sec + chrono_mission.Duration.tv_sec +
         (local_48.tv_nsec + chrono_mission.Duration.tv_nsec) / 1000000000) -
         chrono_mission.Start.tv_sec;
    local_48.tv_nsec =
         (local_48.tv_nsec + chrono_mission.Duration.tv_nsec) % 1000000000 -
         chrono_mission.Start.tv_nsec;
    if (local_48.tv_nsec < 0) {
      local_48.tv_sec = local_48.tv_sec + local_48.tv_nsec / 1000000000 + -1;
      local_48.tv_nsec = local_48.tv_nsec % 1000000000 + 1000000000;
    }
    chrono_mission.Duration.tv_sec = local_48.tv_sec;
    chrono_mission.Duration.tv_nsec = local_48.tv_nsec;
  }
  memset(szAction,0,0x100);
  memset(labels,0,0x1000);
  memset(procdefineaddrs,0,0x400);
  memset(procreturnaddrs,0,0x400);
  memset(procstackids,0,0x400);
  memset(registers,0,0x100);
  bDeleteRoute = 1;
  nbwpstmp = 0;
  memset(wpstmplat,0,0x2000);
  memset(wpstmplong,0,0x2000);
  memset(wpstmpalt,0,0x2000);
  bWaypointsChanged = 1;
  nbWPs = 0;
  CurWP = 0;
  memset(wpslat,0,0x2000);
  memset(wpslong,0,0x2000);
  memset(wpsalt,0,0x2000);
  rudderminangle = -0.7;
  ruddermidangle = 0.0;
  ruddermaxangle = 0.7;
  HeadingAndLateralControlMode = 2;
  if (((robid != 0x1000000) && (robid != 0x2000000)) && (robid != 0x4000000)) {
    HeadingAndLateralControlMode = 0;
  }
  return 0;
}

Assistant:

inline int InitGlobals(void)
{
	int i = 0;

	// Missing error checking...

	seanetfilenextlinecmd = -1;

	for (i = 0; i < MAX_NB_BLUEVIEW; i++)
	{
		bPauseBlueView[i] = FALSE;
		bRestartBlueView[i] = FALSE;
	}

	for (i = 0; i < MAX_NB_NMEADEVICE; i++)
	{
		GNSSqualityNMEADevice[i] = 0;
		bPauseNMEADevice[i] = FALSE;
		bRestartNMEADevice[i] = FALSE;
	}

	for (i = 0; i < MAX_NB_UBLOX; i++)
	{
		GNSSqualityublox[i] = 0;
		bPauseublox[i] = FALSE;
		bRestartublox[i] = FALSE;
		RTCMuserslist.push_back(RTCMusers[i]);
	}

	for (i = 0; i < MAX_NB_MAVLINKDEVICE; i++)
	{
		bEnableMAVLinkDeviceIN[i] = FALSE;
		bDisplayStatusTextMAVLinkDevice[i] = FALSE;
		custom_modeMAVLinkDevice[i] = -1;
		iArmMAVLinkDevice[i] = -1;
		setattitudetargetperiodMAVLinkDevice[i] = -1;
		setattitudetargettypeMAVLinkDevice[i] = -1;
		setattitudetargetrollMAVLinkDevice[i] = 0;
		setattitudetargetpitchMAVLinkDevice[i] = 0;
		setattitudetargetyawMAVLinkDevice[i] = 0;
		setattitudetargetroll_rateMAVLinkDevice[i] = 0;
		setattitudetargetpitch_rateMAVLinkDevice[i] = 0;
		setattitudetargetyaw_rateMAVLinkDevice[i] = 0;
		setattitudetargetthrustMAVLinkDevice[i] = 0;
		bTakeoffMAVLinkDevice[i] = FALSE;
		takeoff_altitudeMAVLinkDevice[i] = 0;
		bLandMAVLinkDevice[i] = FALSE;
		land_yawMAVLinkDevice[i] = 0;
		land_latitudeMAVLinkDevice[i] = 0;
		land_longitudeMAVLinkDevice[i] = 0;
		land_altitudeMAVLinkDevice[i] = 0;
		u1_servo_out_MAVLinkDevice[i] = 0;
		u2_servo_out_MAVLinkDevice[i] = 0;
		u3_servo_out_MAVLinkDevice[i] = 0;
		u4_servo_out_MAVLinkDevice[i] = 0;
		u5_servo_out_MAVLinkDevice[i] = 0;
		u6_servo_out_MAVLinkDevice[i] = 0;
		u7_servo_out_MAVLinkDevice[i] = 0;
		u8_servo_out_MAVLinkDevice[i] = 0;
		GNSSqualityMAVLinkDevice[i] = 0;
		bPauseMAVLinkDevice[i] = FALSE;
		bRestartMAVLinkDevice[i] = FALSE;
	}

	for (i = 0; i < MAX_NB_POLOLU; i++)
	{
		ShowGetPositionMaestroPololu[i] = -1;
		SetPositionMaestroPololu[i] = -1;
		bPausePololu[i] = FALSE;
		bRestartPololu[i] = FALSE;
	}

	for (i = 0; i < MAX_NB_ROBOTEQ; i++)
	{
		bPauseRoboteq[i] = FALSE;
		bRestartRoboteq[i] = FALSE;
	}

	for (i = 0; i < MAX_NB_VIDEO; i++)
	{
		InitCriticalSection(&imgsCS[i]);
#ifndef DISABLE_OPENCV_SUPPORT
		imgs[i] = cvCreateImage(cvSize(videoimgwidth, videoimgheight), IPL_DEPTH_8U, 3);
#ifndef USE_OPENCV_HIGHGUI_CPP_API
		cvSet(imgs[i], CV_RGB(0, 0, 0), NULL);
#else
		imgmats[i] = cv::cvarrToMat(imgs[i]);
		imgmats[i] = cv::Mat::zeros(imgmats[i].size(), imgmats[i].type());
#endif // !USE_OPENCV_HIGHGUI_CPP_API
		if (bUseRawImgPtrVideo) imgsbak[i] = imgs[i]; // To be able to release memory later if imgs is overwritten...
#endif // !DISABLE_OPENCV_SUPPORT
		HorizontalBeamVideo[i] = 70;
		VerticalBeamVideo[i] = 50;
		xVideo[i] = 0; yVideo[i] = 0; zVideo[i] = 0; phiVideo[i] = 0; thetaVideo[i] = 0; psiVideo[i] = 0;
		bPauseVideo[i] = FALSE;
		bRestartVideo[i] = FALSE;
		InitCriticalSection(&VideoRecordRequestsCS[i]);
		VideoRecordRequests[i] = 0;
		bVideoRecordRestart[i] = FALSE;
#ifndef DISABLE_OPENCV_SUPPORT
#ifndef USE_OPENCV_HIGHGUI_CPP_API
		videorecordfiles[i] = NULL;
#endif // !USE_OPENCV_HIGHGUI_CPP_API
#endif // !DISABLE_OPENCV_SUPPORT
		memset(videorecordfilenames[i], 0, sizeof(videorecordfilenames[i]));
		endvideorecordfiles[i] = NULL;
		memset(endvideorecordfilenames[i], 0, sizeof(endvideorecordfilenames[i]));
		videorecordwidth[i] = videoimgwidth;
		videorecordheight[i] = videoimgheight;
	}

	for (i = 0; i < nbopencvgui; i++)
	{
		InitCriticalSection(&dispimgsCS[i]);
#ifndef DISABLE_OPENCV_SUPPORT
		dispimgs[i] = cvCreateImage(cvSize(opencvguiimgwidth[i], opencvguiimgheight[i]), IPL_DEPTH_8U, 3);
#ifndef USE_OPENCV_HIGHGUI_CPP_API
		cvSet(dispimgs[i], CV_RGB(0, 0, 0), NULL);
#else
		dispimgmats[i] = cv::cvarrToMat(dispimgs[i]);
		dispimgmats[i] = cv::Mat::zeros(dispimgmats[i].size(), dispimgmats[i].type());
#endif // !USE_OPENCV_HIGHGUI_CPP_API
#endif // !DISABLE_OPENCV_SUPPORT
	}

	InitCriticalSection(&SonarAltitudeEstimationCS);

#ifndef DISABLE_OPENCV_SUPPORT
	InitCriticalSection(&ExternalVisualLocalizationCS);
	InitCriticalSection(&ExternalVisualLocalizationOverlayImgCS);
	ExternalVisualLocalizationOverlayImg = cvCreateImage(cvSize(videoimgwidth, videoimgheight), IPL_DEPTH_8U, 3);
#ifndef USE_OPENCV_HIGHGUI_CPP_API
	cvSet(ExternalVisualLocalizationOverlayImg, CV_RGB(0, 0, 0), NULL);
#else
	ExternalVisualLocalizationOverlayImgMat = cv::cvarrToMat(ExternalVisualLocalizationOverlayImg);
	ExternalVisualLocalizationOverlayImgMat = cv::Mat::zeros(ExternalVisualLocalizationOverlayImgMat.size(), ExternalVisualLocalizationOverlayImgMat.type());
#endif // !USE_OPENCV_HIGHGUI_CPP_API

	InitCriticalSection(&WallCS);
	InitCriticalSection(&WallOverlayImgCS);
	WallOverlayImg = cvCreateImage(cvSize(videoimgwidth, videoimgheight), IPL_DEPTH_8U, 3);
#ifndef USE_OPENCV_HIGHGUI_CPP_API
	cvSet(WallOverlayImg, CV_RGB(0, 0, 0), NULL);
#else
	WallOverlayImgMat = cv::cvarrToMat(WallOverlayImg);
	WallOverlayImgMat = cv::Mat::zeros(WallOverlayImgMat.size(), WallOverlayImgMat.type());
#endif // !USE_OPENCV_HIGHGUI_CPP_API

	for (i = 0; i < MAX_NB_BALL; i++)
	{
		bBallTrackingControl[i] = FALSE;
		InitCriticalSection(&BallCS[i]);
		InitCriticalSection(&BallOverlayImgCS[i]);
		BallOverlayImg[i] = cvCreateImage(cvSize(videoimgwidth, videoimgheight), IPL_DEPTH_8U, 3);
#ifndef USE_OPENCV_HIGHGUI_CPP_API
		cvSet(BallOverlayImg[i], CV_RGB(0, 0, 0), NULL);
#else
		BallOverlayImgMat[i] = cv::cvarrToMat(BallOverlayImg[i]);
		BallOverlayImgMat[i] = cv::Mat::zeros(BallOverlayImgMat[i].size(), BallOverlayImgMat[i].type());
#endif // !USE_OPENCV_HIGHGUI_CPP_API
		hmin_ball[i] = 0; hmax_ball[i] = 0; smin_ball[i] = 0; smax_ball[i] = 0; vlmin_ball[i] = 0; vlmax_ball[i] = 0;
		bHExclusive_ball[i] = FALSE; bSExclusive_ball[i] = FALSE; bVLExclusive_ball[i] = FALSE;
		r_selpix_ball[i] = 0, g_selpix_ball[i] = 0, b_selpix_ball[i] = 0;
		colormodel_ball[i] = 0;
		objMinRadiusRatio_ball[i] = 0; objRealRadius_ball[i] = 0; objMinDetectionRatio_ball[i] = 0; objDetectionRatioDuration_ball[i] = 0; d0_ball[i] = 0;
		kh_ball[i] = 0; kv_ball[i] = 0;
		lightMin_ball[i] = 0;
		lightPixRatio_ball[i] = 0;
		bAcoustic_ball[i] = 0;
		bDepth_ball[i] = 0;
		camdir_ball[i] = 0;
		bDisableControl_ball[i] = FALSE;
		bBrake_ball[i] = FALSE;
		objtype_ball[i] = 0;
		mindistproc_ball[i] = 0;
		procid_ball[i] = 0;
		videoid_ball[i] = 0;
		u_ball[i] = 0;
		x_ball[i] = 0; y_ball[i] = 0; z_ball[i] = 0;
		psi_ball[i] = 0;
		lat_ball[i] = 0; long_ball[i] = 0; alt_ball[i] = 0;
		heading_ball[i] = 0;
		detectratio_ball[i] = 0;
		bBallFound[i] = FALSE;
		lightStatus_ball[i] = 0;
	}

	InitCriticalSection(&SurfaceVisualObstacleCS);
	InitCriticalSection(&SurfaceVisualObstacleOverlayImgCS);
	SurfaceVisualObstacleOverlayImg = cvCreateImage(cvSize(videoimgwidth, videoimgheight), IPL_DEPTH_8U, 3);
#ifndef USE_OPENCV_HIGHGUI_CPP_API
	cvSet(SurfaceVisualObstacleOverlayImg, CV_RGB(0, 0, 0), NULL);
#else
	SurfaceVisualObstacleOverlayImgMat = cv::cvarrToMat(SurfaceVisualObstacleOverlayImg);
	SurfaceVisualObstacleOverlayImgMat = cv::Mat::zeros(SurfaceVisualObstacleOverlayImgMat.size(), SurfaceVisualObstacleOverlayImgMat.type());
#endif // !USE_OPENCV_HIGHGUI_CPP_API

	InitCriticalSection(&ObstacleCS);
	InitCriticalSection(&ObstacleOverlayImgCS);
	ObstacleOverlayImg = cvCreateImage(cvSize(videoimgwidth, videoimgheight), IPL_DEPTH_8U, 3);
#ifndef USE_OPENCV_HIGHGUI_CPP_API
	cvSet(ObstacleOverlayImg, CV_RGB(0, 0, 0), NULL);
#else
	ObstacleOverlayImgMat = cv::cvarrToMat(ObstacleOverlayImg);
	ObstacleOverlayImgMat = cv::Mat::zeros(ObstacleOverlayImgMat.size(), ObstacleOverlayImgMat.type());
#endif // !USE_OPENCV_HIGHGUI_CPP_API

	InitCriticalSection(&PingerCS);
	InitCriticalSection(&PingerOverlayImgCS);
	PingerOverlayImg = cvCreateImage(cvSize(videoimgwidth, videoimgheight), IPL_DEPTH_8U, 3);
#ifndef USE_OPENCV_HIGHGUI_CPP_API
	cvSet(PingerOverlayImg, CV_RGB(0, 0, 0), NULL);
#else
	PingerOverlayImgMat = cv::cvarrToMat(PingerOverlayImg);
	PingerOverlayImgMat = cv::Mat::zeros(PingerOverlayImgMat.size(), PingerOverlayImgMat.type());
#endif // !USE_OPENCV_HIGHGUI_CPP_API
#endif // !DISABLE_OPENCV_SUPPORT

	for (i = 0; i < MAX_NB_EXTERNALPROGRAMTRIGGER; i++)
	{
		bExternalProgramTrigger[i] = FALSE;
		InitCriticalSection(&ExternalProgramTriggerCS[i]);
		memset(ExternalProgramTriggerFileName[i], 0, MAX_BUF_LEN);
		period_externalprogramtrigger[i] = 100;
		retrydelay_externalprogramtrigger[i] = 100;
		nbretries_externalprogramtrigger[i] = -1;
		procid_externalprogramtrigger[i] = -1;
		bExternalProgramTriggerDetected[i] = FALSE;
	}

	InitCriticalSection(&FollowMeCS);

	InitCriticalSection(&MDMCS);

	InitCriticalSection(&SeanetOverlayImgCS);
	InitCriticalSection(&SeanetConnectingCS);
	InitCriticalSection(&SeanetDataCS);
#ifndef DISABLE_OPENCV_SUPPORT
	SeanetOverlayImg = cvCreateImage(cvSize(videoimgwidth, videoimgheight), IPL_DEPTH_8U, 3);
#ifndef USE_OPENCV_HIGHGUI_CPP_API
	cvSet(SeanetOverlayImg, CV_RGB(0, 0, 0), NULL);
#else
	SeanetOverlayImgMat = cv::cvarrToMat(SeanetOverlayImg);
	SeanetOverlayImgMat = cv::Mat::zeros(SeanetOverlayImgMat.size(), SeanetOverlayImgMat.type());
#endif // !USE_OPENCV_HIGHGUI_CPP_API
	colorsonarlidar = CV_RGB(255, 255, 0);
	fSeanetOverlayImg = SONAR_IMG_LEVER_ARMS|SONAR_IMG_ALL_DISTANCES|SONAR_IMG_NORMAL;
#endif // !DISABLE_OPENCV_SUPPORT

	InitCriticalSection(&StateVariablesCS);

	InitCriticalSection(&MissionFilesCS);

	InitCriticalSection(&OpenCVGUICS);
	InitCriticalSection(&OpenCVVideoCS);
	InitCriticalSection(&OpenCVVideoRecordCS);

	InitCriticalSection(&idsCS);

	InitCriticalSection(&RegistersCS);

	InitCriticalSection(&strtimeCS);

	opencvguikey = -1;
	opencvguikeytargetid = -1;

	StartChrono(&chrono_mission);
	StopChronoQuick(&chrono_mission);
	memset(szAction, 0, sizeof(szAction));
	memset(labels, 0, sizeof(labels));
	memset(procdefineaddrs, 0, sizeof(procdefineaddrs));
	memset(procreturnaddrs, 0, sizeof(procreturnaddrs));
	memset(procstackids, 0, sizeof(procstackids));

	memset(registers, 0, sizeof(registers));
	
	bDeleteRoute = TRUE;
	nbwpstmp = 0;
	memset(wpstmplat, 0, MAX_NB_WP*sizeof(double));
	memset(wpstmplong, 0, MAX_NB_WP*sizeof(double));
	memset(wpstmpalt, 0, MAX_NB_WP*sizeof(double));
	bWaypointsChanged = TRUE;
	nbWPs = 0;
	CurWP = 0;
	memset(wpslat, 0, MAX_NB_WP*sizeof(double));
	memset(wpslong, 0, MAX_NB_WP*sizeof(double));
	memset(wpsalt, 0, MAX_NB_WP*sizeof(double));

	rudderminangle = -0.7;
	ruddermidangle = 0.0;
	ruddermaxangle = 0.7;

	switch (robid)
	{
	case QUADRO_SIMULATOR_ROBID:
	case COPTER_ROBID:
	case ARDUCOPTER_ROBID:
		HeadingAndLateralControlMode = HEADING_AND_LATERAL_CONTROL_MODE;
		break;
	default:
		HeadingAndLateralControlMode = PURE_HEADING_CONTROL_MODE;
		break;
	}

	return EXIT_SUCCESS;
}